

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_numType(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  byte bVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  undefined4 in_register_00000034;
  
  if ((getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar2 != 0)) {
    getp_numType::desc.min_argc_ = 0;
    getp_numType::desc.opt_argc_ = 0;
    getp_numType::desc.varargs_ = 0;
    __cxa_guard_release(&getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_numType::desc);
  if (iVar2 == 0) {
    bVar1 = (this->super_CVmObject).ext_[4];
    if ((bVar1 & 6) == 4) {
      vVar3 = (bVar1 & 1) * 4 + 4;
    }
    else if ((bVar1 & 6) == 0) {
      vVar3 = (bVar1 & 1) * 0x10 + 0x11;
      if ((bVar1 & 8) == 0) {
        vVar3 = 1;
      }
    }
    else {
      vVar3 = 2;
    }
    retval->typ = VM_INT;
    (retval->val).obj = vVar3;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_numType(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set the appropriate flags */
    switch (get_type(ext_))
    {
    case VMBN_T_NUM:
        retval->set_int(NumTypeNum
                        | (is_zero(ext_)
                           ? (get_neg(ext_) ? NumTypeNZero : NumTypePZero)
                           : 0));
        break;

    case VMBN_T_INF:
        retval->set_int(get_neg(ext_) ? NumTypeNInf : NumTypePInf);
        break;

    case VMBN_T_NAN:
    default:
        retval->set_int(NumTypeNAN);
        break;
    }

    /* handled */
    return TRUE;
}